

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrfd_crowdhuman.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  undefined8 *in_RSI;
  int in_EDI;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects;
  Mat m;
  char *imagepath;
  vector<FaceObject,_std::allocator<FaceObject>_> *in_stack_00000258;
  Mat *in_stack_00000260;
  vector<FaceObject,_std::allocator<FaceObject>_> *in_stack_00000e20;
  Mat *in_stack_00000e28;
  allocator *this;
  allocator local_99;
  string local_98 [32];
  string local_78 [96];
  char *local_18;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 2) {
    pcVar1 = (char *)in_RSI[1];
    this = &local_99;
    local_18 = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,this);
    cv::imread(local_78,(int)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) == 0) {
      std::vector<FaceObject,_std::allocator<FaceObject>_>::vector
                ((vector<FaceObject,_std::allocator<FaceObject>_> *)0x167955);
      detect_scrfd(in_stack_00000e28,in_stack_00000e20);
      draw_faceobjects(in_stack_00000260,in_stack_00000258);
      local_4 = 0;
      std::vector<FaceObject,_std::allocator<FaceObject>_>::~vector
                ((vector<FaceObject,_std::allocator<FaceObject>_> *)this);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",local_18);
      local_4 = -1;
    }
    cv::Mat::~Mat((Mat *)local_78);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<FaceObject> faceobjects;
    detect_scrfd(m, faceobjects);

    draw_faceobjects(m, faceobjects);

    return 0;
}